

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BrDeleteNetworkSuccess_Test::TestBody
          (InterpreterTestSuite_PC_BrDeleteNetworkSuccess_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  pointer pDVar4;
  pointer pNVar5;
  _Alloc_hider _Var6;
  Registry *pRVar7;
  bool bVar8;
  Status SVar9;
  char *pcVar10;
  Status local_46a;
  Status local_469;
  AssertionResult gtest_ar_7;
  undefined1 local_458 [16];
  DomainArray doms;
  NetworkArray nwks;
  string local_408;
  AssertionResult gtest_ar_1;
  Expression expr;
  BorderRouterArray bra;
  undefined1 local_3a0 [16];
  _Alloc_hider local_390;
  char local_380 [16];
  string local_370;
  State local_350;
  State local_34c;
  undefined1 local_348 [32];
  ByteArray local_328;
  undefined1 local_310 [24];
  char local_2f8 [16];
  undefined1 local_2e8 [16];
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  bra.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&bra);
  _Var6 = value.mError.mMessage._M_dataplus;
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&bra);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nwks,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xaa6,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nwks,(Message *)&bra);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwks);
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(bra.
         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
         ._M_impl.super__Vector_impl_data._M_start)->_vptr_BorderRouter[1])();
    }
    _Var6._M_p = value.mError.mMessage._M_dataplus._M_p;
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) goto LAB_00198ff0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )_Var6._M_p;
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
  }
  else {
    if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10)
      {
        operator_delete(*value.mError.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var6._M_p);
    }
    pRVar7 = ctx.mRegistry;
    bra.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&bra.
                   super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.1","");
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nwks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nwks,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_34c,0,0,0,0,0);
    expr.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&expr.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&expr,"net1","");
    doms.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&doms.
                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&doms,"");
    gtest_ar_7._0_8_ = local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_7,"");
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
    local_348._0_8_ = (pointer)0x0;
    local_348._8_8_ = (pointer)0x0;
    local_348._16_8_ = (pointer)0x0;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"domain1","");
    local_310._8_8_ = local_2f8;
    pcVar10 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_310 + 8),"","");
    ot::commissioner::UnixTime::UnixTime((UnixTime *)(local_2e8 + 8),0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)&bra,0x4e21,&local_328,(string *)&nwks,local_34c,
               (string *)&expr,1,(string *)&doms,(string *)&gtest_ar_7,(Timestamp)0x0,0,&local_408,
               (ByteArray *)local_348,&local_370,'\0',0,(string *)(local_310 + 8),
               (UnixTime)local_2e8._8_8_,0x103f);
    local_469 = ot::commissioner::persistent_storage::Registry::Add(pRVar7,(BorderAgent *)&value);
    local_46a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_469,&local_46a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    if ((char *)local_310._8_8_ != local_2f8) {
      operator_delete((void *)local_310._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    if ((pointer)local_348._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((undefined1 *)gtest_ar_7._0_8_ != local_458) {
      operator_delete((void *)gtest_ar_7._0_8_);
    }
    if (doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(nwks.
                      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&bra.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar3._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         gtest_ar_1.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&value);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = *(char **)gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xaaa,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) goto LAB_00198ff0;
      if (*(void **)gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
          (void *)((long)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 0x10)) {
        operator_delete(*(void **)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
      }
    }
    else {
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        if (*(void **)gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
            (void *)((long)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x10)) {
          operator_delete(*(void **)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
        }
        operator_delete((void *)uVar3._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      }
      pRVar7 = ctx.mRegistry;
      bra.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&bra.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.2","");
      local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nwks.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&nwks.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&nwks,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&expr,"net2","");
      doms.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&doms.
                     super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&doms,"");
      gtest_ar_7._0_8_ = local_458;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_7,"");
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
      local_348._0_8_ = (pointer)0x0;
      local_348._8_8_ = (pointer)0x0;
      local_348._16_8_ = (pointer)0x0;
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"domain2","");
      local_310._8_8_ = local_2f8;
      local_310._0_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_310 + 8));
      ot::commissioner::UnixTime::UnixTime((UnixTime *)local_2e8,0);
      pcVar10 = (char *)(ulong)(uint)local_350;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)&bra,0x4e22,&local_328,(string *)&nwks,local_350,
                 (string *)&expr,2,(string *)&doms,(string *)&gtest_ar_7,(Timestamp)0x0,0,&local_408
                 ,(ByteArray *)local_348,&local_370,'\0',0,(string *)(local_310 + 8),
                 (UnixTime)local_2e8._0_8_,0x103f);
      local_469 = ot::commissioner::persistent_storage::Registry::Add(pRVar7,(BorderAgent *)&value);
      local_46a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_469,&local_46a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      if ((char *)local_310._8_8_ != local_2f8) {
        operator_delete((void *)local_310._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      if ((pointer)local_348._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_348._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if ((undefined1 *)gtest_ar_7._0_8_ != local_458) {
        operator_delete((void *)gtest_ar_7._0_8_);
      }
      if (doms.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&doms.
                    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(doms.
                        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&expr.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (nwks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&nwks.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(nwks.
                        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&bra.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (gtest_ar_1.success_ != false) {
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          if (*(void **)gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
              (void *)((long)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x10)) {
            operator_delete(*(void **)gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
          }
          operator_delete((void *)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        }
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        paVar1 = &value.mError.mMessage.field_2;
        value.mError.mCode = kNone;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        paVar2 = &value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&bra.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
        value.mData._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"br delete --nwk net1","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&doms,&ctx.mInterpreter,(string *)&bra);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nwks);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&doms);
        if (bra.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(bra.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ot::commissioner::Interpreter::Eval((Value *)&bra,&ctx.mInterpreter,&expr);
        value.mError.mCode =
             (ErrorCode)
             bra.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::operator=
                  ((string *)&value.mError.mMessage,
                   (string *)
                   &bra.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_390);
        if (local_390._M_p != local_380) {
          operator_delete(local_390._M_p);
        }
        if (bra.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_3a0) {
          operator_delete(bra.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        }
        bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar8);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (!bVar8) {
          testing::Message::Message((Message *)&doms);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&bra,(internal *)&nwks,(AssertionResult *)0x2e6ffe,"false","true",
                     pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xab5,(char *)bra.
                                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
          if (bra.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(bra.
                            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        pNVar5 = nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             nwks.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pNVar5);
        }
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar9 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                          (ctx.mRegistry,&bra);
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(doms.
                               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,SVar9);
        gtest_ar_7._0_8_ = gtest_ar_7._0_8_ & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwks,"ctx.mRegistry->GetAllBorderRouters(bra)",
                   "RegistryStatus::kSuccess",(Status *)&doms,&gtest_ar_7.success_);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)nwks.
                                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xab8,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        pNVar5 = nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             nwks.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pNVar5);
        }
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((long)bra.
                              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)bra.
                              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x7d6343eb1a1f58d1);
        gtest_ar_7._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&nwks,"bra.size()","1",(unsigned_long *)&doms,(int *)&gtest_ar_7);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)nwks.
                                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xab9,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        pNVar5 = nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             nwks.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pNVar5);
        }
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar8 = (bool)ot::commissioner::persistent_storage::Registry::GetAllNetworks
                                (ctx.mRegistry,&nwks);
        gtest_ar_7.success_ = bVar8;
        local_408._M_dataplus._M_p = local_408._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&doms,"ctx.mRegistry->GetAllNetworks(nwks)",
                   "RegistryStatus::kSuccess",&gtest_ar_7.success_,(Status *)&local_408);
        if ((char)doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&gtest_ar_7);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)doms.
                                super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xabc,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_408,(Message *)&gtest_ar_7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
          if (gtest_ar_7._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
          }
        }
        pDVar4 = doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (doms.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               doms.
               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             doms.
                             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pDVar4);
        }
        gtest_ar_7._0_8_ =
             ((long)nwks.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)nwks.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        local_408._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&doms,"nwks.size()","1",(unsigned_long *)&gtest_ar_7,
                   (int *)&local_408);
        if ((char)doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&gtest_ar_7);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)doms.
                                super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xabd,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_408,(Message *)&gtest_ar_7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
          if (gtest_ar_7._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_7._0_8_ + 8))();
          }
        }
        pDVar4 = doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (doms.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               doms.
               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             doms.
                             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pDVar4);
        }
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar9 = ot::commissioner::persistent_storage::Registry::GetAllDomains(ctx.mRegistry,&doms);
        local_408._M_dataplus._M_p._0_1_ = SVar9;
        local_370._M_dataplus._M_p = local_370._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&gtest_ar_7,"ctx.mRegistry->GetAllDomains(doms)",
                   "RegistryStatus::kSuccess",(Status *)&local_408,(Status *)&local_370);
        if (gtest_ar_7.success_ == false) {
          testing::Message::Message((Message *)&local_408);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xac0,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_370,(Message *)&local_408);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
          if ((long *)local_408._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_408._M_dataplus._M_p + 8))();
          }
        }
        uVar3._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          if (*(void **)gtest_ar_7.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
              (void *)((long)gtest_ar_7.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x10)) {
            operator_delete(*(void **)gtest_ar_7.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
          }
          operator_delete((void *)uVar3._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        }
        local_408._M_dataplus._M_p =
             (pointer)(((long)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)
        ;
        local_370._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&gtest_ar_7,"doms.size()","1",(unsigned_long *)&local_408,
                   (int *)&local_370);
        if (gtest_ar_7.success_ == false) {
          testing::Message::Message((Message *)&local_408);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_7.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xac1,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_370,(Message *)&local_408);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_408._M_dataplus._M_p + 8))();
          }
        }
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          if (*(void **)gtest_ar_7.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
              (void *)((long)gtest_ar_7.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0x10)) {
            operator_delete(*(void **)gtest_ar_7.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
          }
          operator_delete((void *)gtest_ar_7.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        }
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::~vector(&doms);
        std::
        vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ::~vector(&nwks);
        std::
        vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ::~vector(&bra);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mData._M_dataplus._M_p != paVar2) {
          operator_delete(value.mData._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&expr);
        goto LAB_00198ff0;
      }
      testing::Message::Message((Message *)&value);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        local_310._0_8_ =
             *(undefined8 *)
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xaae,(char *)local_310._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) goto LAB_00198ff0;
      if (*(void **)gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
          (void *)((long)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 0x10)) {
        operator_delete(*(void **)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
      }
    }
  }
  operator_delete((void *)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
LAB_00198ff0:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteNetworkSuccess)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);

    NetworkArray nwks;
    EXPECT_EQ(ctx.mRegistry->GetAllNetworks(nwks), RegistryStatus::kSuccess);
    EXPECT_EQ(nwks.size(), 1);

    DomainArray doms;
    EXPECT_EQ(ctx.mRegistry->GetAllDomains(doms), RegistryStatus::kSuccess);
    EXPECT_EQ(doms.size(), 1);
}